

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cctest.cc
# Opt level: O0

void PrintTestList(CcTest *current)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  CcTest *in_RDI;
  CcTest *in_stack_fffffffffffffff0;
  
  if (in_RDI != (CcTest *)0x0) {
    CcTest::prev(in_RDI);
    PrintTestList(in_stack_fffffffffffffff0);
    pcVar1 = CcTest::dependency(in_RDI);
    if (pcVar1 == (char *)0x0) {
      pcVar1 = CcTest::file(in_RDI);
      pcVar2 = CcTest::name(in_RDI);
      printf("%s/%s<\n",pcVar1,pcVar2);
    }
    else {
      pcVar1 = CcTest::file(in_RDI);
      pcVar2 = CcTest::name(in_RDI);
      pcVar3 = CcTest::dependency(in_RDI);
      printf("%s/%s<%s\n",pcVar1,pcVar2,pcVar3);
    }
  }
  return;
}

Assistant:

static void PrintTestList(CcTest* current) {
  if (current == NULL) return;
  PrintTestList(current->prev());
  if (current->dependency() != NULL) {
    printf("%s/%s<%s\n",
           current->file(), current->name(), current->dependency());
  } else {
    printf("%s/%s<\n", current->file(), current->name());
  }
}